

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::~BasicAuthIntegrationTest
          (BasicAuthIntegrationTest *this)

{
  BasicAuthIntegrationTest *this_local;
  
  (this->super_IntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BasicAuthIntegrationTest_00241e00;
  std::shared_ptr<prometheus::Registry>::~shared_ptr(&this->registry_);
  std::__cxx11::string::~string((string *)&this->password_);
  std::__cxx11::string::~string((string *)&this->username_);
  std::__cxx11::string::~string((string *)&this->counter_name_);
  IntegrationTest::~IntegrationTest(&this->super_IntegrationTest);
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }